

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *out_g;
  ImVec2 *out_b;
  ImGuiWindow *pIVar1;
  undefined1 __src [8];
  ImDrawList *pIVar2;
  undefined4 uVar3;
  uint uVar4;
  ImU32 col_00;
  ImU32 IVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  char *text_end;
  ImGuiContext *pIVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ImGuiContext *g;
  byte bVar10;
  undefined7 uVar12;
  ulong uVar11;
  char cVar13;
  ImVec2 *pIVar14;
  ImU32 col_01;
  bool bVar15;
  uint uVar16;
  int iVar17;
  float fVar18;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  ImVec2 IVar19;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  ImVec2 p_min;
  ImVec2 pos;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float fVar20;
  float fVar21;
  ImVec2 p_max;
  ImVec2 gradient_p1;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 half_sz_00;
  float fVar28;
  uint uVar29;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float local_28c;
  float local_288;
  float V;
  uint local_280;
  float local_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  ImGuiContext *local_250;
  uint local_248;
  float B;
  float G;
  float R;
  ImVec2 *local_238;
  ImDrawList *local_230;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  ImVec2 local_218;
  uint local_20c;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  ImVec2 local_1e0;
  float local_1d8;
  float fStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  ImVec2 current_off_unrotated;
  float vv;
  float fStack_19c;
  ImVec2 local_198;
  ImVec2 picker_pos;
  char local_188;
  float ww;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  ImVec2 tra;
  float uu;
  float fStack_104;
  float local_100;
  float local_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  size_t local_d0;
  ulong local_c8;
  ImGuiWindow *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  ImVec2 trc;
  float backup_initial_col [4];
  ImVec2 uv_white;
  ImVec2 trb;
  undefined1 auVar23 [16];
  
  pIVar6 = GImGui;
  uStack_260 = local_268;
  local_268 = (undefined1  [8])ref_col;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems != false) {
    bVar10 = 0;
    goto LAB_00188765;
  }
  local_230 = pIVar1->DrawList;
  local_278._0_4_ = CalcItemWidth();
  local_278._4_4_ = extraout_XMM0_Db;
  fStack_270 = (float)extraout_XMM0_Dc;
  fStack_26c = (float)extraout_XMM0_Dd;
  local_250 = pIVar6;
  (pIVar6->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar9 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar9);
  }
  pIVar6 = local_250;
  if ((flags & 0x6000000U) == 0) {
    uVar4 = local_250->ColorEditOptions & 0x6000000;
    uVar16 = 0x2000000;
    if (uVar4 != 0) {
      uVar16 = uVar4;
    }
    uVar9 = uVar9 | uVar16;
  }
  if ((uVar9 & 0x18000000) == 0) {
    uVar4 = local_250->ColorEditOptions & 0x18000000;
    uVar16 = 0x8000000;
    if (uVar4 != 0) {
      uVar16 = uVar4;
    }
    uVar9 = uVar9 | uVar16;
  }
  uVar16 = (uVar9 & 0x6000000) - 1;
  if ((uVar9 & 0x6000000 ^ uVar16) <= uVar16) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x1206,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  uVar16 = (uVar9 & 0x18000000) - 1;
  if ((uVar9 & 0x18000000 ^ uVar16) <= uVar16) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x1207,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((uVar9 & 8) == 0) {
    uVar9 = uVar9 | local_250->ColorEditOptions & 0x10000U;
  }
  local_20c = uVar9 & 0x10002;
  bVar15 = local_20c == 0x10000;
  IVar19 = (pIVar1->DC).CursorPos;
  local_238 = (ImVec2 *)col;
  picker_pos = IVar19;
  local_c0 = pIVar1;
  local_1d8 = GetFrameHeight();
  pIVar14 = local_238;
  fVar18 = (pIVar6->Style).ItemInnerSpacing.x;
  fVar30 = (float)local_278._0_4_ - (local_1d8 + fVar18) * (float)(byte)(bVar15 + 1);
  uVar16 = -(uint)(fVar30 <= local_1d8);
  fVar28 = (float)(local_278._4_4_ & (uint)extraout_XMM0_Db_00);
  uVar4 = (uint)fStack_270 & extraout_XMM0_Dc_00;
  uVar29 = (uint)fStack_26c & extraout_XMM0_Dd_00;
  fVar20 = (float)(uVar16 & (uint)local_1d8 | ~uVar16 & (uint)fVar30);
  local_d0 = (ulong)((uVar9 & 2) == 0) * 4 + 0xc;
  fStack_1d4 = extraout_XMM0_Db_00;
  uStack_1d0 = extraout_XMM0_Dc_00;
  uStack_1cc = extraout_XMM0_Dd_00;
  memcpy(backup_initial_col,local_238,local_d0);
  local_27c = fVar20 * 0.08;
  local_b8 = ZEXT416((uint)(fVar20 * 0.5));
  fVar21 = fVar20 * 0.5 - local_27c;
  _local_e8 = ZEXT416((uint)fVar21);
  fVar30 = IVar19.x;
  local_88._0_4_ = fVar30;
  local_98 = fVar20 + fVar30;
  _local_278 = ZEXT416((uint)(fVar18 + local_98));
  local_218.x = (local_1d8 + fVar20) * 0.5 + fVar30;
  fVar35 = IVar19.y;
  local_218.y = fVar20 * 0.5 + fVar35;
  triangle_pa.x = fVar21 - (float)(int)(fVar20 * 0.027);
  triangle_pa.y = 0.0;
  local_1e0.x = triangle_pa.x * -0.5;
  local_1e0.y = triangle_pa.x * -0.866025;
  local_138._4_4_ = local_218.y;
  local_138._0_4_ = local_218.x;
  fStack_130 = fStack_1d4 * 0.0 + 0.0;
  fStack_12c = fVar28 * 0.0 + 0.0;
  triangle_pc.y = triangle_pa.x * 0.866025;
  local_28c = pIVar14->x;
  local_288 = pIVar14->y;
  V = pIVar14[1].x;
  B = V;
  G = local_288;
  R = local_28c;
  triangle_pc.x = local_1e0.x;
  fStack_94 = fVar28;
  uStack_90 = uVar4;
  uStack_8c = uVar29;
  if ((uVar9 >> 0x1b & 1) == 0) {
    if ((uVar9 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_28c,local_288,V,&R,&G,&B);
    }
  }
  else {
    ColorConvertRGBtoHSV(local_28c,local_288,V,&local_28c,&local_288,&V);
    iVar8 = bcmp(pIVar6->ColorEditLastColor,pIVar14,0xc);
    if (iVar8 == 0) {
      if ((local_288 == 0.0) && (!NAN(local_288))) {
        local_28c = pIVar6->ColorEditLastHue;
      }
      if ((V == 0.0) && (!NAN(V))) {
        local_288 = pIVar6->ColorEditLastSat;
      }
    }
  }
  local_228._4_4_ = fStack_1d4;
  local_228._0_4_ = local_1d8 + (float)local_278._0_4_;
  fStack_220 = (float)uStack_1d0;
  fStack_21c = (float)uStack_1cc;
  PushItemFlag(8,true);
  uVar12 = (undefined7)((ulong)pIVar6 >> 8);
  local_148 = fVar35;
  fStack_144 = fVar35;
  fStack_140 = fVar35;
  fStack_13c = fVar35;
  local_f8 = fVar35;
  fStack_f4 = fVar35;
  fStack_f0 = fVar35;
  fStack_ec = fVar35;
  if ((uVar9 >> 0x1a & 1) == 0) {
    if ((uVar9 >> 0x19 & 1) == 0) {
      uVar16 = 0;
      local_280 = 0;
      uVar11 = 0;
    }
    else {
      current_off_unrotated.y = fVar20;
      current_off_unrotated.x = fVar20;
      InvisibleButton("sv",&current_off_unrotated);
      bVar15 = IsItemActive();
      if (bVar15) {
        auVar22._0_4_ = fVar20 + -1.0;
        IVar19 = (pIVar6->IO).MousePos;
        auVar32._0_4_ = IVar19.x - fVar30;
        auVar32._4_4_ = IVar19.y - fVar35;
        auVar32._8_8_ = 0;
        auVar22._4_4_ = auVar22._0_4_;
        auVar22._8_4_ = auVar22._0_4_;
        auVar22._12_4_ = auVar22._0_4_;
        auVar32 = divps(auVar32,auVar22);
        fVar30 = auVar32._0_4_;
        fVar21 = auVar32._4_4_;
        iVar8 = -(uint)(1.0 < fVar30);
        iVar17 = -(uint)(1.0 < fVar21);
        auVar24._4_4_ = iVar17;
        auVar24._0_4_ = iVar8;
        auVar24._8_4_ = iVar17;
        auVar24._12_4_ = iVar17;
        auVar23._8_8_ = auVar24._8_8_;
        auVar23._4_4_ = iVar8;
        auVar23._0_4_ = iVar8;
        uVar16 = movmskpd((int)CONCAT71(extraout_var,bVar15),auVar23);
        local_288 = 1.0;
        if ((uVar16 & 1) == 0) {
          local_288 = fVar30;
        }
        local_288 = (float)(~-(uint)(fVar30 < 0.0) & (uint)local_288);
        fVar30 = 0.0;
        if ((uVar16 & 2) == 0) {
          fVar30 = 1.0 - fVar21;
        }
        V = (float)(-(uint)(fVar21 < 0.0) & 0x3f800000 | ~-(uint)(fVar21 < 0.0) & (uint)fVar30);
        uVar16 = (uint)CONCAT71((uint7)(uint3)(uVar16 >> 8),1);
      }
      else {
        uVar16 = 0;
      }
      if ((uVar9 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      current_off_unrotated.y = local_148;
      current_off_unrotated.x = (float)local_278._0_4_;
      SetCursorScreenPos(&current_off_unrotated);
      current_off_unrotated.y = fVar20;
      current_off_unrotated.x = local_1d8;
      InvisibleButton("hue",&current_off_unrotated);
      bVar15 = IsItemActive();
      if (bVar15) {
        fVar30 = ((pIVar6->IO).MousePos.y - local_f8) / (fVar20 + -1.0);
        local_28c = 1.0;
        if (fVar30 <= 1.0) {
          local_28c = fVar30;
        }
        local_28c = (float)(~-(uint)(fVar30 < 0.0) & (uint)local_28c);
        local_280 = (uint)CONCAT71(extraout_var_00,1);
        uVar11 = CONCAT71(uVar12,1);
      }
      else {
        local_280 = 0;
        uVar11 = (ulong)uVar16;
      }
    }
  }
  else {
    current_off_unrotated.y = fVar20;
    current_off_unrotated.x = (pIVar6->Style).ItemInnerSpacing.x + fVar20 + local_1d8;
    InvisibleButton("hsv",&current_off_unrotated);
    bVar15 = IsItemActive();
    if (bVar15) {
      fVar34 = (pIVar6->IO).MouseClickedPos[0].x - (float)local_138._0_4_;
      fVar36 = (pIVar6->IO).MouseClickedPos[0].y - (float)local_138._4_4_;
      fVar21 = (pIVar6->IO).MousePos.x - (float)local_138._0_4_;
      fVar30 = (pIVar6->IO).MousePos.y - (float)local_138._4_4_;
      local_a8 = ZEXT416((uint)fVar30);
      fVar35 = fVar34 * fVar34 + fVar36 * fVar36;
      _local_138 = ZEXT416((uint)fVar34);
      if ((fVar35 < ((float)local_e8._0_4_ + -1.0) * ((float)local_e8._0_4_ + -1.0)) ||
         (((float)local_b8._0_4_ + 1.0) * ((float)local_b8._0_4_ + 1.0) < fVar35)) {
        local_280 = 0;
      }
      else {
        fVar30 = atan2f(fVar30,fVar21);
        fVar30 = (fVar30 / 3.1415927) * 0.5;
        local_28c = (float)(~-(uint)(fVar30 < 0.0) & (uint)fVar30 |
                           (uint)(fVar30 + 1.0) & -(uint)(fVar30 < 0.0));
        local_280 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      fVar30 = cosf(local_28c * -2.0 * 3.1415927);
      fVar35 = sinf(local_28c * -2.0 * 3.1415927);
      uVar3 = local_138._0_4_;
      local_138._4_4_ = extraout_XMM0_Db_01;
      local_138._0_4_ = fVar35;
      fStack_130 = (float)extraout_XMM0_Dc_01;
      fStack_12c = (float)extraout_XMM0_Dd_01;
      current_off_unrotated.x = fVar30 * (float)uVar3 + -fVar36 * fVar35;
      current_off_unrotated.y = fVar35 * (float)uVar3 + fVar30 * fVar36;
      bVar15 = ImTriangleContainsPoint(&triangle_pa,&local_1e0,&triangle_pc,&current_off_unrotated);
      if (bVar15) {
        current_off_unrotated.x = fVar30 * fVar21 + -(float)local_a8._0_4_ * (float)local_138._0_4_;
        current_off_unrotated.y = (float)local_138._0_4_ * fVar21 + fVar30 * (float)local_a8._0_4_;
        bVar15 = ImTriangleContainsPoint
                           (&triangle_pa,&local_1e0,&triangle_pc,&current_off_unrotated);
        if (!bVar15) {
          current_off_unrotated =
               ImTriangleClosestPoint(&triangle_pa,&local_1e0,&triangle_pc,&current_off_unrotated);
        }
        ImTriangleBarycentricCoords
                  (&triangle_pa,&local_1e0,&triangle_pc,&current_off_unrotated,&uu,&vv,&ww);
        fVar21 = 1.0 - vv;
        fVar30 = 1.0;
        if (fVar21 <= 1.0) {
          fVar30 = fVar21;
        }
        V = (float)(-(uint)(fVar21 < 0.0001) & 0x38d1b717 | ~-(uint)(fVar21 < 0.0001) & (uint)fVar30
                   );
        fVar21 = uu / V;
        fVar30 = 1.0;
        if (fVar21 <= 1.0) {
          fVar30 = fVar21;
        }
        local_288 = (float)(-(uint)(fVar21 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar21 < 0.0001) & (uint)fVar30);
        uVar16 = 1;
        uVar11 = CONCAT71(uVar12,1);
        pIVar6 = local_250;
        pIVar14 = local_238;
      }
      else {
        uVar16 = 0;
        uVar11 = (ulong)local_280;
      }
    }
    else {
      uVar16 = 0;
      local_280 = 0;
      uVar11 = 0;
    }
    if ((uVar9 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  fVar18 = fVar18 + (float)local_228._0_4_;
  if (local_20c == 0x10000) {
    current_off_unrotated.y = local_148;
    current_off_unrotated.x = fVar18;
    SetCursorScreenPos(&current_off_unrotated);
    current_off_unrotated.y = fVar20;
    current_off_unrotated.x = local_1d8;
    InvisibleButton("alpha",&current_off_unrotated);
    bVar15 = IsItemActive();
    if (bVar15) {
      fVar21 = ((pIVar6->IO).MousePos.y - local_f8) / (fVar20 + -1.0);
      fVar30 = 1.0;
      if (fVar21 <= 1.0) {
        fVar30 = fVar21;
      }
      pIVar14[1].y = (float)(-(uint)(fVar21 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar21 < 0.0) & (uint)(1.0 - fVar30));
      uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
    }
  }
  PopItemFlag();
  if ((uVar9 >> 8 & 1) == 0) {
    SameLine(0.0,(pIVar6->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar9) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar9 >> 8 & 1) != 0) {
      SameLine(0.0,(pIVar6->Style).ItemInnerSpacing.x);
    }
    TextEx(label,text_end,0);
  }
  if ((uVar9 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    current_off_unrotated = *pIVar14;
    __src = local_268;
    if ((char)uVar9 < '\0') {
      Text("Current");
    }
    IVar19.x = local_1d8 * 3.0;
    IVar19.y = local_1d8 * 2.0;
    uStack_260._0_4_ = local_1d8 * 0.0;
    local_268._0_4_ = IVar19.x;
    local_268._4_4_ = IVar19.y;
    uStack_260._4_4_ = local_1d8 * 0.0;
    ColorButton("##current",(ImVec4 *)&current_off_unrotated,uVar9 & 0x180e0040,IVar19);
    if (__src != (undefined1  [8])0x0) {
      Text("Original");
      _uu = *(undefined8 *)__src;
      local_100 = *(float *)((long)__src + 8);
      if ((uVar9 & 2) == 0) {
        local_fc = *(float *)((long)__src + 0xc);
      }
      else {
        local_fc = 1.0;
      }
      bVar15 = ColorButton("##original",(ImVec4 *)&uu,uVar9 & 0x180e0040,(ImVec2)local_268);
      if (bVar15) {
        memcpy(pIVar14,(void *)__src,local_d0);
        uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  fVar30 = local_1d8 * 0.2;
  fVar21 = 0.0;
  fVar35 = 0.0;
  fVar34 = 0.0;
  out_g = &pIVar14->y;
  out_b = pIVar14 + 1;
  local_188 = (char)uVar16;
  if (((char)local_280 != '\0') || (local_188 != '\0')) {
    if ((uVar9 >> 0x1b & 1) == 0) {
      if ((uVar9 >> 0x1c & 1) != 0) {
        pIVar14->x = local_28c;
        pIVar14->y = local_288;
        pIVar14[1].x = V;
      }
    }
    else {
      _local_268 = ZEXT416((uint)fVar30);
      ColorConvertHSVtoRGB
                ((float)(~-(uint)(1.0 <= local_28c) & (uint)local_28c |
                        (uint)(local_28c + -1e-05) & -(uint)(1.0 <= local_28c)),
                 (float)(~-(uint)(0.0 < local_288) & 0x3727c5ac |
                        (uint)local_288 & -(uint)(0.0 < local_288)),
                 (float)(~-(uint)(0.0 < V) & 0x358637bd | (uint)V & -(uint)(0.0 < V)),&pIVar14->x,
                 out_g,&out_b->x);
      pIVar6->ColorEditLastHue = local_28c;
      pIVar6->ColorEditLastSat = local_288;
      fVar30 = pIVar14->y;
      pIVar6->ColorEditLastColor[0] = pIVar14->x;
      pIVar6->ColorEditLastColor[1] = fVar30;
      pIVar6->ColorEditLastColor[2] = pIVar14[1].x;
      fVar30 = (float)local_268._0_4_;
      fVar21 = (float)local_268._4_4_;
      fVar35 = (float)uStack_260;
      fVar34 = uStack_260._4_4_;
    }
  }
  iVar8 = (int)fVar30;
  if ((uVar9 & 0x20) == 0) {
    local_268._4_4_ = (int)fVar21;
    local_268._0_4_ = (int)fVar30;
    uStack_260._0_4_ = (float)(int)fVar35;
    uStack_260._4_4_ = (float)(int)fVar34;
    fVar30 = fVar18;
    if (local_20c != 0x10000) {
      fVar30 = (float)local_278._0_4_;
    }
    PushItemWidth((fVar30 + local_1d8) - (float)local_88._0_4_);
    uVar16 = uVar9 & 0x198e001a;
    cVar13 = '\x01';
    if (((uVar9 >> 0x14 & 1) != 0 || (uVar9 & 0x600000) == 0) &&
       (bVar15 = ColorEdit4("##rgb",&local_238->x,uVar16 | 0x100004), bVar15)) {
      uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
      if (local_250->ActiveId == 0) {
        cVar13 = '\x01';
      }
      else {
        cVar13 = local_250->ActiveIdAllowOverlap;
      }
    }
    if ((uVar9 >> 0x15 & 1) != 0 || (uVar9 & 0x500000) == 0) {
      bVar15 = ColorEdit4("##hsv",&local_238->x,uVar16 | 0x200004);
      uVar11 = CONCAT71((int7)(uVar11 >> 8),(byte)uVar11 | bVar15);
    }
    if ((uVar9 >> 0x16 & 1) != 0 || (uVar9 & 0x300000) == 0) {
      bVar15 = ColorEdit4("##hex",&local_238->x,uVar16 | 0x400004);
      uVar11 = CONCAT71((int7)(uVar11 >> 8),(byte)uVar11 | bVar15);
    }
    PopItemWidth();
    pIVar14 = local_238;
    pIVar6 = local_250;
    if ((uVar9 >> 0x1b & 1) != 0 && cVar13 == '\0') {
      ColorConvertRGBtoHSV
                (local_238->x,local_238->y,local_238[1].x,&current_off_unrotated.x,&uu,&vv);
      pIVar6 = local_250;
      uVar11 = uVar11 & 0xffffffff;
      if ((current_off_unrotated.x <= 0.0) && (0.0 < local_28c)) {
        if (0.0 < vv) {
LAB_00187af2:
          if (0.0 < uu) goto LAB_00187b18;
          fVar30 = local_288 * 0.5;
        }
        else {
          if ((V == vv) && (!NAN(V) && !NAN(vv))) goto LAB_00187af2;
          vv = V * 0.5;
          fVar30 = local_288;
        }
        ColorConvertHSVtoRGB(local_28c,fVar30,vv,&pIVar14->x,out_g,&out_b->x);
      }
    }
LAB_00187b18:
    iVar8 = local_268._0_4_;
  }
  fVar30 = (float)iVar8;
  if ((char)uVar11 != '\0') {
    if ((uVar9 >> 0x1b & 1) == 0) {
      if ((uVar9 >> 0x1c & 1) != 0) {
        local_28c = pIVar14->x;
        local_288 = pIVar14->y;
        V = pIVar14[1].x;
        ColorConvertHSVtoRGB(local_28c,local_288,V,&R,&G,&B);
      }
    }
    else {
      R = pIVar14->x;
      G = pIVar14->y;
      B = pIVar14[1].x;
      ColorConvertRGBtoHSV(R,G,B,&local_28c,&local_288,&V);
      iVar8 = bcmp(pIVar6->ColorEditLastColor,pIVar14,0xc);
      if (iVar8 == 0) {
        if ((local_288 == 0.0) && (!NAN(local_288))) {
          local_28c = pIVar6->ColorEditLastHue;
        }
        if ((V == 0.0) && (!NAN(V))) {
          local_288 = pIVar6->ColorEditLastSat;
        }
      }
    }
  }
  local_fc = (pIVar6->Style).Alpha;
  fVar21 = 1.0;
  if (local_fc <= 1.0) {
    fVar21 = local_fc;
  }
  iVar8 = (int)((float)(~-(uint)(local_fc < 0.0) & (uint)fVar21) * 255.0 + 0.5);
  uu = 1.0;
  fStack_104 = 1.0;
  local_100 = 1.0;
  uVar16 = iVar8 * 0x1000000;
  local_c8 = (ulong)uVar16;
  local_268 = (undefined1  [8])(CONCAT44(iVar8 << 0x18,iVar8 << 0x18) | 0xffff000000ff);
  uStack_260._0_4_ = (float)(iVar8 << 0x18 | 0xff00);
  uStack_260._4_4_ = (float)(iVar8 << 0x18 | 0xffff00);
  local_148 = (float)(uVar16 + 0xffffff);
  current_off_unrotated = (ImVec2)(CONCAT44(iVar8 << 0x18,iVar8 << 0x18) | 0xffff000000ff);
  col_01 = uVar16 + 0x808080;
  ColorConvertHSVtoRGB(local_28c,1.0,1.0,&uu,&fStack_104,&local_100);
  col_00 = ColorConvertFloat4ToU32((ImVec4 *)&uu);
  fStack_19c = G;
  vv = R;
  local_198.y = (pIVar6->Style).Alpha;
  local_198.x = B;
  IVar5 = ColorConvertFloat4ToU32((ImVec4 *)&vv);
  pIVar2 = local_230;
  ww = 0.0;
  fStack_14c = 0.0;
  local_a8._0_4_ = IVar5;
  fVar21 = (float)local_268._0_4_;
  if ((uVar9 >> 0x1a & 1) == 0) {
    if ((uVar9 >> 0x19 & 1) != 0) {
      fStack_19c = local_f8 + fVar20;
      vv = local_98;
      local_248 = (uint)uVar11;
      ImDrawList::AddRectFilledMultiColor
                (local_230,&picker_pos,(ImVec2 *)&vv,(ImU32)local_148,col_00,col_00,(ImU32)local_148
                );
      local_268._4_4_ = fVar20;
      local_268._0_4_ = fVar20;
      uStack_260._0_4_ = fVar20;
      uStack_260._4_4_ = fVar20;
      vv = picker_pos.x + fVar20;
      fStack_19c = picker_pos.y + fVar20;
      ImDrawList::AddRectFilledMultiColor
                (pIVar2,&picker_pos,(ImVec2 *)&vv,0,0,(ImU32)local_c8,(ImU32)local_c8);
      p_max.x = (float)local_268._0_4_ + picker_pos.x;
      p_max.y = (float)local_268._4_4_ + picker_pos.y;
      RenderFrameBorder(picker_pos,p_max,0.0);
      auVar31._4_4_ = 1.0 - V;
      auVar31._0_4_ = local_288;
      auVar31._8_8_ = 0;
      auVar32 = minps(_DAT_0019a190,auVar31);
      fVar35 = picker_pos.x;
      fVar34 = picker_pos.y;
      auVar25._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_288) & auVar32._0_4_) * (float)local_268._0_4_
                        + fVar35 + 0.5);
      auVar25._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - V) & auVar32._4_4_) * (float)local_268._4_4_ +
                        fVar34 + 0.5);
      auVar25._8_4_ = (float)(int)(auVar32._8_4_ * (float)uStack_260 + 0.0 + 0.0);
      auVar25._12_4_ = (float)(int)(auVar32._12_4_ * uStack_260._4_4_ + 0.0 + 0.0);
      auVar33._0_4_ = (float)local_268._0_4_ + fVar35 + -2.0;
      auVar33._4_4_ = (float)local_268._4_4_ + fVar34 + -2.0;
      auVar33._8_4_ = (float)uStack_260 + 0.0 + 0.0;
      auVar33._12_4_ = uStack_260._4_4_ + 0.0 + 0.0;
      auVar32 = minps(auVar33,auVar25);
      uVar9 = -(uint)(auVar25._0_4_ < fVar35 + 2.0);
      uVar16 = -(uint)(auVar25._4_4_ < fVar34 + 2.0);
      fStack_14c = (float)(~uVar16 & auVar32._4_4_ | (uint)(fVar34 + 2.0) & uVar16);
      ww = (float)(~uVar9 & auVar32._0_4_ | (uint)(fVar35 + 2.0) & uVar9);
      local_268._4_4_ = fVar28;
      local_268._0_4_ = fVar20 / 6.0;
      uStack_260._0_4_ = (float)uVar4;
      uStack_260._4_4_ = (float)uVar29;
      lVar7 = 0;
      while( true ) {
        if (lVar7 == 6) break;
        fStack_19c = (float)(int)lVar7 * (float)local_268._0_4_ + picker_pos.y;
        vv = (float)local_278._0_4_;
        tra.y = (float)(int)(lVar7 + 1) * (float)local_268._0_4_ + picker_pos.y;
        tra.x = (float)local_228._0_4_;
        fVar28 = (&current_off_unrotated.y)[lVar7];
        ImDrawList::AddRectFilledMultiColor
                  (local_230,(ImVec2 *)&vv,&tra,(ImU32)fVar21,(ImU32)fVar21,(ImU32)fVar28,
                   (ImU32)fVar28);
        lVar7 = lVar7 + 1;
        fVar21 = fVar28;
      }
      _local_268 = ZEXT416((uint)(float)(int)(local_28c * fVar20 + picker_pos.y + 0.5));
      p_min.y = picker_pos.y;
      p_min.x = (float)local_278._0_4_;
      p_max_00.y = fVar20 + picker_pos.y;
      p_max_00.x = (float)local_228._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_278._0_4_ + -1.0;
      pos.y = (float)local_268._0_4_;
      half_sz.x = fVar30 + 1.0;
      half_sz.y = fVar30;
      RenderArrowsForVerticalBar(local_230,pos,half_sz,local_1d8 + 2.0,(pIVar6->Style).Alpha);
      uVar11 = (ulong)local_248;
    }
  }
  else {
    local_88 = ZEXT416((uint)(0.5 / (float)local_b8._0_4_));
    local_98 = 5.60519e-45;
    if (4 < (int)(float)local_b8._0_4_ / 0xc) {
      local_98 = (float)((int)(float)local_b8._0_4_ / 0xc);
    }
    local_138._4_4_ = 0x80000000;
    local_138._0_4_ = -(0.5 / (float)local_b8._0_4_);
    fStack_130 = -0.0;
    fStack_12c = -0.0;
    local_b8._0_4_ = (float)local_b8._0_4_ + (float)local_e8._0_4_;
    local_f8 = (float)local_b8._0_4_ * 0.5;
    local_e8._4_4_ = local_e8._0_4_;
    fStack_e0 = (float)local_e8._0_4_;
    fStack_dc = (float)local_e8._0_4_;
    local_248 = (uint)uVar11;
    for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
      fVar28 = (float)(int)lVar7 / 6.0;
      fVar35 = (fVar28 + fVar28) * 3.1415927 + (float)local_138._0_4_;
      fVar28 = ((float)(int)lVar7 + 1.0) / 6.0;
      fVar28 = (fVar28 + fVar28) * 3.1415927 + (float)local_88._0_4_;
      local_268._0_4_ = fVar28;
      iVar8 = (pIVar2->VtxBuffer).Size;
      ImDrawList::PathArcTo(pIVar2,&local_218,local_f8,fVar35,fVar28,(int)local_98);
      ImDrawList::PathStroke(pIVar2,(ImU32)local_148,false,local_27c);
      iVar17 = (pIVar2->VtxBuffer).Size;
      _local_228 = ZEXT416((uint)local_218.x);
      local_278._0_4_ = cosf(fVar35);
      local_278._4_4_ = extraout_XMM0_Db_02;
      fStack_270 = (float)extraout_XMM0_Dc_02;
      fStack_26c = (float)extraout_XMM0_Dd_02;
      auVar26._4_4_ = local_218.y;
      auVar26._0_4_ = local_228._0_4_;
      auVar26._8_4_ = local_228._4_4_;
      auVar26._12_4_ = 0;
      _local_228 = auVar26;
      fVar28 = sinf(fVar35);
      fVar35 = (float)local_278._4_4_ * fStack_e0;
      local_278._4_4_ = fVar28 * (float)local_e8._4_4_ + (float)local_228._4_4_;
      local_278._0_4_ = (float)local_278._0_4_ * (float)local_e8._0_4_ + (float)local_228._0_4_;
      fStack_270 = fVar35 + fStack_220;
      fStack_26c = extraout_XMM0_Db_03 * fStack_dc + fStack_21c;
      _local_228 = ZEXT416((uint)local_218.x);
      fVar28 = cosf((float)local_268._0_4_);
      auVar27._4_4_ = local_218.y;
      auVar27._0_4_ = local_228._0_4_;
      auVar27._8_4_ = local_228._4_4_;
      auVar27._12_4_ = 0;
      _local_228 = auVar27;
      fVar35 = sinf((float)local_268._0_4_);
      gradient_p1.x = fVar28 * (float)local_e8._0_4_ + (float)local_228._0_4_;
      gradient_p1.y = fVar35 * (float)local_e8._4_4_ + (float)local_228._4_4_;
      fVar28 = (&current_off_unrotated.y)[lVar7];
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar2,iVar8,iVar17,(ImVec2)local_278,gradient_p1,(ImU32)fVar21,(ImU32)fVar28);
      fVar21 = fVar28;
    }
    local_278._0_4_ = cosf((local_28c + local_28c) * 3.1415927);
    local_278._4_4_ = extraout_XMM0_Db_04;
    fStack_270 = (float)extraout_XMM0_Dc_03;
    fStack_26c = (float)extraout_XMM0_Dd_03;
    local_228._0_4_ = sinf((local_28c + local_28c) * 3.1415927);
    pIVar2 = local_230;
    local_228._4_4_ = extraout_XMM0_Db_05;
    fStack_220 = (float)extraout_XMM0_Dc_04;
    fStack_21c = (float)extraout_XMM0_Dd_04;
    vv = (float)local_278._0_4_ * (float)local_b8._0_4_ * 0.5 + local_218.x;
    fStack_19c = (float)local_228._0_4_ * (float)local_b8._0_4_ * 0.5 + local_218.y;
    if ((char)local_280 == '\0') {
      fVar21 = 0.55;
    }
    else {
      fVar21 = 0.65;
    }
    uVar11 = (ulong)local_248;
    local_27c = local_27c * fVar21;
    iVar8 = 0x20;
    if ((int)(local_27c / 1.4) < 0x20) {
      iVar8 = (int)(local_27c / 1.4);
    }
    iVar17 = 9;
    if (9 < iVar8) {
      iVar17 = iVar8;
    }
    ImDrawList::AddCircleFilled(local_230,(ImVec2 *)&vv,local_27c,col_00,iVar17);
    ImDrawList::AddCircle(pIVar2,(ImVec2 *)&vv,local_27c + 1.0,col_01,iVar17,1.0);
    ImDrawList::AddCircle(pIVar2,(ImVec2 *)&vv,local_27c,(ImU32)local_148,iVar17,1.0);
    tra.x = triangle_pa.x * (float)local_278._0_4_ + -triangle_pa.y * (float)local_228._0_4_ +
            local_218.x;
    tra.y = triangle_pa.x * (float)local_228._0_4_ + triangle_pa.y * (float)local_278._0_4_ +
            local_218.y;
    trb.x = local_1e0.x * (float)local_278._0_4_ + -local_1e0.y * (float)local_228._0_4_ +
            local_218.x;
    trb.y = local_1e0.x * (float)local_228._0_4_ + local_1e0.y * (float)local_278._0_4_ +
            local_218.y;
    trc.x = triangle_pc.x * (float)local_278._0_4_ + -triangle_pc.y * (float)local_228._0_4_ +
            local_218.x;
    trc.y = triangle_pc.x * (float)local_228._0_4_ + triangle_pc.y * (float)local_278._0_4_ +
            local_218.y;
    uv_white = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve(pIVar2,6,6);
    ImDrawList::PrimVtx(pIVar2,&tra,&uv_white,col_00);
    ImDrawList::PrimVtx(pIVar2,&trb,&uv_white,col_00);
    ImDrawList::PrimVtx(pIVar2,&trc,&uv_white,(ImU32)local_148);
    ImDrawList::PrimVtx(pIVar2,&tra,&uv_white,0);
    ImDrawList::PrimVtx(pIVar2,&trb,&uv_white,(ImU32)local_c8);
    ImDrawList::PrimVtx(pIVar2,&trc,&uv_white,0);
    ImDrawList::AddTriangle(pIVar2,&tra,&trb,&trc,col_01,1.5);
    fVar21 = 1.0;
    if (local_288 <= 1.0) {
      fVar21 = local_288;
    }
    fVar21 = (float)(~-(uint)(local_288 < 0.0) & (uint)fVar21);
    fVar35 = 1.0 - V;
    fVar28 = 1.0;
    if (fVar35 <= 1.0) {
      fVar28 = fVar35;
    }
    fVar28 = (float)(~-(uint)(fVar35 < 0.0) & (uint)fVar28);
    fVar35 = fVar21 * (tra.x - trc.x) + trc.x;
    fVar21 = fVar21 * (tra.y - trc.y) + trc.y;
    ww = fVar28 * (trb.x - fVar35) + fVar35;
    fStack_14c = fVar28 * (trb.y - fVar21) + fVar21;
  }
  pIVar2 = local_230;
  uVar3 = local_a8._0_4_;
  if (local_188 == '\0') {
    fVar21 = 6.0;
  }
  else {
    fVar21 = 10.0;
  }
  local_278._0_4_ = fVar21;
  ImDrawList::AddCircleFilled(local_230,(ImVec2 *)&ww,fVar21,local_a8._0_4_,0xc);
  ImDrawList::AddCircle(pIVar2,(ImVec2 *)&ww,(float)local_278._0_4_ + 1.0,col_01,0xc,1.0);
  ImDrawList::AddCircle(pIVar2,(ImVec2 *)&ww,(float)local_278._0_4_,(ImU32)local_148,0xc,1.0);
  pIVar14 = local_238;
  if (local_20c == 0x10000) {
    fVar21 = local_238[1].y;
    _local_228 = ZEXT416((uint)fVar21);
    fVar28 = 1.0;
    if (fVar21 <= 1.0) {
      fVar28 = fVar21;
    }
    _local_278 = ZEXT416((uint)(1.0 - fVar28));
    fStack_19c = picker_pos.y;
    vv = fVar18;
    local_198.x = fVar18 + local_1d8;
    local_198.y = picker_pos.y + fVar20;
    RenderColorRectWithAlphaCheckerboard
              (pIVar2,_vv,local_198,0,(local_198.x - fVar18) * 0.5,(ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (pIVar2,(ImVec2 *)&vv,&local_198,uVar3,uVar3,uVar3 & 0xffffff,uVar3 & 0xffffff);
    local_278._4_4_ = (float)(int)(float)(~local_228._4_4_ & local_278._4_4_);
    local_278._0_4_ =
         (float)(int)((float)(-(uint)((float)local_228._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_228._0_4_ < 0.0) & local_278._0_4_) * fVar20 +
                      picker_pos.y + 0.5);
    fStack_270 = (float)(int)(float)(~(uint)fStack_220 & (uint)fStack_270);
    fStack_26c = (float)(int)(float)(~(uint)fStack_21c & (uint)fStack_26c);
    RenderFrameBorder(_vv,local_198,0.0);
    pos_00.x = fVar18 + -1.0;
    pos_00.y = (float)local_278._0_4_;
    half_sz_00.x = fVar30 + 1.0;
    half_sz_00.y = fVar30;
    RenderArrowsForVerticalBar(pIVar2,pos_00,half_sz_00,local_1d8 + 2.0,(local_250->Style).Alpha);
  }
  EndGroup();
  pIVar1 = local_c0;
  if ((char)uVar11 != '\0') {
    iVar8 = bcmp(backup_initial_col,pIVar14,local_d0);
    uVar11 = uVar11 & 0xff;
    if (iVar8 == 0) {
      uVar11 = 0;
    }
  }
  bVar10 = (byte)uVar11;
  if ((uVar11 & 1) != 0) {
    MarkItemEdited((pIVar1->DC).LastItemId);
  }
  PopID();
LAB_00188765:
  return (bool)(bVar10 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0)
        {
            if (S == 0)
                H = g.ColorEditLastHue;
            if (V == 0)
                S = g.ColorEditLastSat;
        }
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            memcpy(g.ColorEditLastColor, col, sizeof(float) * 3);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0) // Fix local Hue as display below will use it immediately.
            {
                if (S == 0)
                    H = g.ColorEditLastHue;
                if (V == 0)
                    S = g.ColorEditLastSat;
            }
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}